

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

error assemble_half_float_immediate
                (context *ctx,token *token,opcode *op,int bits,int offset,int neg_bit)

{
  long lVar1;
  long lVar2;
  int iVar3;
  byte bVar4;
  undefined4 in_register_0000000c;
  int in_stack_00000008;
  token local_88;
  token local_60;
  byte local_33;
  ushort local_32;
  int local_30;
  bool negate;
  int iStack_2c;
  uint16_t value;
  int offset_local;
  int bits_local;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  
  _offset_local = (opcode *)CONCAT44(in_register_0000000c,bits);
  bVar4 = (byte)in_stack_00000008;
  local_30 = neg_bit;
  iStack_2c = offset;
  op_local = op;
  token_local = token;
  ctx_local = ctx;
  switch(op[1].reuse) {
  case 1:
  case 6:
  case 7:
    local_33 = op[1].reuse == 7;
    if (op[1].reuse != 1) {
      context::tokenize(&local_60,(context *)token);
      memcpy(op_local,&local_60,0x24);
    }
    iVar3 = equal((token *)op_local,"QNAN");
    if (iVar3 == 0) {
      iVar3 = equal((token *)op_local,"INF");
      if (iVar3 == 0) {
        fail((token *)ctx,(char *)op_local,"expected floating-point literal, QNAN, or INF");
        return (unique_ptr<char[],_std::default_delete<char[]>_>)
               (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
      }
      local_32 = 0x7c00;
    }
    else {
      local_32 = 0x7fff;
    }
    if ((local_33 & 1) != 0) {
      if (in_stack_00000008 < 0) {
        local_32 = local_32 | 0x8000;
      }
      else {
        opcode::add_bits(_offset_local,1L << (bVar4 & 0x3f));
      }
    }
    break;
  default:
    fail((token *)ctx,(char *)op,"expected floating-point literal, QNAN, or INF");
    return (unique_ptr<char[],_std::default_delete<char[]>_>)
           (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
  case 4:
    lVar1._0_4_ = op->reuse;
    lVar1._4_4_ = op->sched;
    local_32 = fp32_to_fp16<(std::float_round_style)1>((float)lVar1);
    lVar2._0_4_ = op_local->reuse;
    lVar2._4_4_ = op_local->sched;
    if ((lVar2 < 0) && (-1 < in_stack_00000008)) {
      opcode::add_bits(_offset_local,1L << (bVar4 & 0x3f));
    }
    break;
  case 5:
    local_32 = fp32_to_fp16<(std::float_round_style)1>((float)*(double *)&op->reuse);
    if ((*(double *)&op_local->reuse <= 0.0 && *(double *)&op_local->reuse != 0.0) &&
       (-1 < in_stack_00000008)) {
      opcode::add_bits(_offset_local,1L << (bVar4 & 0x3f));
    }
  }
  if (iStack_2c == 9) {
    opcode::add_bits(_offset_local,
                     (long)((int)((local_32 & 0x7fff) << 1) >> 7) << ((byte)local_30 & 0x3f));
  }
  else {
    if (iStack_2c != 0x10) {
      __assert_fail("false && \"invalid bits\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/helper.cpp"
                    ,300,
                    "error assemble_half_float_immediate(context &, token &, opcode &, int, int, int)"
                   );
    }
    opcode::add_bits(_offset_local,(ulong)local_32 << ((byte)local_30 & 0x3f));
  }
  context::tokenize(&local_88,(context *)token_local);
  memcpy(op_local,&local_88,0x24);
  memset(ctx,0,8);
  error::error((error *)ctx);
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

error assemble_half_float_immediate(context& ctx, token& token, opcode& op, int bits, int offset,
                                    int neg_bit)
{
    static constexpr char MESSAGE[] = "expected floating-point literal, QNAN, or INF";

    uint16_t value;
    switch (token.type) {
    case token_type::float_immediate:
        value = fp32_to_fp16(token.data.float_immediate);
        if (token.data.float_immediate < 0 && neg_bit >= 0) {
            op.add_bits(1ULL << neg_bit);
        }
        break;
    case token_type::immediate:
        value = fp32_to_fp16(static_cast<float>(token.data.immediate));
        if (token.data.immediate < 0 && neg_bit >= 0) {
            op.add_bits(1ULL << neg_bit);
        }
        break;
    case token_type::plus:
    case token_type::minus:
    case token_type::identifier: {
        const bool negate = token.type == token_type::minus;
        if (token.type != token_type::identifier) {
            token = ctx.tokenize();
        }
        if (equal(token, "QNAN")) {
            value = 0x7fff;
        } else if (equal(token, "INF")) {
            value = 0x7c00;
        } else {
            return fail(token, MESSAGE);
        }
        if (negate) {
            if (neg_bit >= 0) {
                op.add_bits(1ULL << neg_bit);
            } else {
                value |= 0x8000;
            }
        }
        break;
    }
    default:
        return fail(token, MESSAGE);
    }
    if (bits == 9) {
        // TODO: add a setting to warn/error precision losses
        op.add_bits(static_cast<uint64_t>(static_cast<uint16_t>(value << 1) >> 7) << offset);
    } else if (bits == 16) {
        op.add_bits(static_cast<uint64_t>(value) << offset);
    } else {
        assert(false && "invalid bits");
    }
    token = ctx.tokenize();
    return {};
}